

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndDragDropTarget(void)

{
  if (GImGui->DragDropActive == false) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x2b34,"void ImGui::EndDragDropTarget()");
  }
  if (GImGui->DragDropWithinTarget != false) {
    GImGui->DragDropWithinTarget = false;
    return;
  }
  __assert_fail("g.DragDropWithinTarget",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x2b35,"void ImGui::EndDragDropTarget()");
}

Assistant:

void ImGui::EndDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DragDropActive);
    IM_ASSERT(g.DragDropWithinTarget);
    g.DragDropWithinTarget = false;
}